

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gillespie.cpp
# Opt level: O0

void __thiscall Gillespie::DeleteReaction(Gillespie *this,int index)

{
  size_type sVar1;
  range_error *this_00;
  __shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar2;
  double extraout_XMM0_Qa;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_60;
  __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
  local_58;
  const_iterator local_50;
  double *local_48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_38;
  const_iterator local_30;
  int local_14;
  Gillespie *pGStack_10;
  int index_local;
  Gillespie *this_local;
  
  local_14 = index;
  pGStack_10 = this;
  sVar1 = std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::size
                    (&this->reactions_);
  if (((ulong)(long)index < sVar1) && (-1 < local_14)) {
    this_01 = (__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::
              operator[](&this->reactions_,(long)local_14);
    peVar2 = std::__shared_ptr_access<Reaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_01);
    (**peVar2->_vptr_Reaction)();
    this->alpha_sum_ = this->alpha_sum_ - extraout_XMM0_Qa;
    local_40._M_current =
         (double *)std::vector<double,_std::allocator<double>_>::begin(&this->alpha_list_);
    local_38 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(&local_40,(long)local_14);
    __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
    __normal_iterator<double*>
              ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
               &local_30,&local_38);
    local_48 = (double *)
               std::vector<double,_std::allocator<double>_>::erase(&this->alpha_list_,local_30);
    local_60._M_current =
         (shared_ptr<Reaction> *)
         std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::begin
                   (&this->reactions_);
    local_58 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Reaction>_*,_std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>_>
               ::operator+(&local_60,(long)local_14);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Reaction>const*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>
    ::__normal_iterator<std::shared_ptr<Reaction>*>
              ((__normal_iterator<std::shared_ptr<Reaction>const*,std::vector<std::shared_ptr<Reaction>,std::allocator<std::shared_ptr<Reaction>>>>
                *)&local_50,&local_58);
    std::vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>::erase
              (&this->reactions_,local_50);
    return;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error
            (this_00,"Gillespie: Reaction index out of range for reaction deletion.");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void Gillespie::DeleteReaction(int index) {
  if (index >= reactions_.size() || index < 0) {
    throw std::range_error(
        "Gillespie: Reaction index out of range for reaction deletion.");
  }
  // Update alpha sum
  alpha_sum_ -= reactions_[index]->CalculatePropensity();
  // Remove from alpha list
  alpha_list_.erase(alpha_list_.begin() + index);
  // Remove from reactions list
  reactions_.erase(reactions_.begin() + index);
}